

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O3

void __thiscall PyClientSession::send_packet_data(PyClientSession *this,char *data,size_t size)

{
  function overload;
  object o;
  gil_scoped_acquire gil;
  handle local_48;
  object local_40;
  object local_38;
  gil_scoped_acquire local_30;
  size_t local_20;
  
  local_20 = size;
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_30);
  pybind11::get_overload<ki::protocol::net::ClientSession>
            ((pybind11 *)&local_48,&this->super_ClientSession,"send_packet_data");
  if (local_48.m_ptr != (PyObject *)0x0) {
    pybind11::bytes::bytes((bytes *)&local_40,data,size);
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_38,(bytes *)&local_48,
               (unsigned_long *)&local_40);
    pybind11::object::~object(&local_40);
    pybind11::object::~object(&local_38);
    pybind11::object::~object((object *)&local_48);
    pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_30);
    return;
  }
  pybind11::object::~object((object *)&local_48);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_30);
  pybind11::pybind11_fail
            (
            "Tried to call pure virtual function \"ki::protocol::net::ClientSession::send_packet_data\""
            );
}

Assistant:

void send_packet_data(const char *data, const size_t size) override
    {
        PYBIND11_OVERLOAD_PURE(
            void, ki::protocol::net::ClientSession,
            send_packet_data, py::bytes(data, size), size);
    }